

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O0

void __thiscall PlantUmlGenerator::endState(PlantUmlGenerator *this,ostream *output,string *indent)

{
  long lVar1;
  ostream *poVar2;
  string *indent_local;
  ostream *output_local;
  PlantUmlGenerator *this_local;
  
  lVar1 = std::__cxx11::string::size();
  std::__cxx11::string::erase((ulong)indent,lVar1 - 2);
  poVar2 = std::operator<<(output,(string *)indent);
  std::operator<<(poVar2,"}\n");
  return;
}

Assistant:

void PlantUmlGenerator::endState(std::ostream &output, std::string &indent)
{
    indent.erase(indent.size() - 2);
    output << indent << "}\n";
}